

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O3

void pbrt::ErrorExit(FileLoc *loc,char *message)

{
  processError("Error",loc,message);
  DisconnectFromDisplayServer();
  quick_exit(1);
  __errno_location();
  return;
}

Assistant:

void ErrorExit(const FileLoc *loc, const char *message) {
    processError("Error", loc, message);
    DisconnectFromDisplayServer();
#ifdef PBRT_IS_OSX
    exit(1);
#else
    std::quick_exit(1);
#endif
}